

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O2

string * __thiscall
trieste::Location::origin_linecol_abi_cxx11_(string *__return_storage_ptr__,Location *this)

{
  element_type *peVar1;
  ostream *poVar2;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198;
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  peVar1 = (this->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) && ((peVar1->origin_)._M_string_length != 0)) {
    linecol(this);
    poVar2 = std::operator<<(&local_198,
                             (string *)
                             (this->source).
                             super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,":");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string origin_linecol() const
    {
      std::stringstream ss;

      if (source && !source->origin().empty())
      {
        auto [line, col] = linecol();
        ss << source->origin() << ":" << (line + 1) << ":" << (col + 1);
      }

      return ss.str();
    }